

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crnlib.cpp
# Opt level: O0

int __thiscall crnlib::crn_block_compressor::init(crn_block_compressor *this,EVP_PKEY_CTX *ctx)

{
  bool bVar1;
  dxt_format dVar2;
  uint uVar3;
  crn_format fmt;
  pixel_format local_2c;
  pixel_format basic_pixel_fmt;
  crn_format basic_crn_fmt;
  crn_comp_params *params_local;
  crn_block_compressor *this_local;
  
  memcpy(&this->m_comp_params,ctx,0x378);
  dxt_image::pack_params::init(&this->m_pack_params,ctx);
  fmt = crnd::crnd_get_fundamental_dxt_format(*(crn_format *)(ctx + 0x18));
  local_2c = pixel_format_helpers::convert_crn_format_to_pixel_format(fmt);
  bVar1 = crn_comp_params::get_flag((crn_comp_params *)ctx,cCRNCompFlagDXT1AForTransparency);
  if ((bVar1) && (local_2c == PIXEL_FMT_DXT1)) {
    local_2c = PIXEL_FMT_DXT1A;
  }
  dVar2 = pixel_format_helpers::get_dxt_format(local_2c);
  uVar3 = dxt_image::init(&this->m_image,(EVP_PKEY_CTX *)(ulong)(uint)dVar2);
  return CONCAT31((int3)(uVar3 >> 8),(uVar3 & 1) != 0);
}

Assistant:

bool init(const crn_comp_params& params) {
    m_comp_params = params;

    m_pack_params.init(params);

    crn_format basic_crn_fmt = crnd::crnd_get_fundamental_dxt_format(params.m_format);
    pixel_format basic_pixel_fmt = pixel_format_helpers::convert_crn_format_to_pixel_format(basic_crn_fmt);

    if ((params.get_flag(cCRNCompFlagDXT1AForTransparency)) && (basic_pixel_fmt == PIXEL_FMT_DXT1))
      basic_pixel_fmt = PIXEL_FMT_DXT1A;

    if (!m_image.init(pixel_format_helpers::get_dxt_format(basic_pixel_fmt), cDXTBlockSize, cDXTBlockSize, false))
      return false;

    return true;
  }